

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

xxh_u64 XXH64_finalize(xxh_u64 h64,xxh_u8 *ptr,size_t len,XXH_alignment align)

{
  xxh_u32 xVar1;
  ulong uVar2;
  xxh_u64 xVar3;
  uint in_EDX;
  byte *in_RSI;
  ulong in_RDI;
  xxh_u64 k1_23;
  xxh_u64 k1_22;
  xxh_u64 k1_21;
  xxh_u64 k1_20;
  xxh_u64 k1_19;
  xxh_u64 k1_18;
  xxh_u64 k1_17;
  xxh_u64 k1_16;
  xxh_u64 k1_15;
  xxh_u64 k1_14;
  xxh_u64 k1_13;
  xxh_u64 k1_12;
  xxh_u64 k1_11;
  xxh_u64 k1_10;
  xxh_u64 k1_9;
  xxh_u64 k1_8;
  xxh_u64 k1_7;
  xxh_u64 k1_6;
  xxh_u64 k1_5;
  xxh_u64 k1_4;
  xxh_u64 k1_3;
  xxh_u64 k1_2;
  xxh_u64 k1_1;
  xxh_u64 k1;
  void *in_stack_ffffffffffffff08;
  byte *local_18;
  ulong local_10;
  xxh_u64 local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  switch(in_EDX & 0x1f) {
  case 0x18:
    xVar3 = XXH_readLE64_align(in_stack_ffffffffffffff08,XXH_aligned);
    xVar3 = XXH64_round(0,xVar3);
    local_10 = ((xVar3 ^ in_RDI) << 0x1b | (xVar3 ^ in_RDI) >> 0x25) * -0x61c8864e7a143579 +
               0x85ebca77c2b2ae63;
  case 0x10:
    xVar3 = XXH_readLE64_align(in_stack_ffffffffffffff08,XXH_aligned);
    xVar3 = XXH64_round(0,xVar3);
    local_10 = ((xVar3 ^ local_10) << 0x1b | (xVar3 ^ local_10) >> 0x25) * -0x61c8864e7a143579 +
               0x85ebca77c2b2ae63;
  case 8:
    xVar3 = XXH_readLE64_align(in_stack_ffffffffffffff08,XXH_aligned);
    xVar3 = XXH64_round(0,xVar3);
    local_8 = XXH64_avalanche(((xVar3 ^ local_10) << 0x1b | (xVar3 ^ local_10) >> 0x25) *
                              -0x61c8864e7a143579 + 0x85ebca77c2b2ae63);
    break;
  case 0x19:
    xVar3 = XXH_readLE64_align(in_stack_ffffffffffffff08,XXH_aligned);
    xVar3 = XXH64_round(0,xVar3);
    local_18 = in_RSI + 8;
    local_10 = ((xVar3 ^ in_RDI) << 0x1b | (xVar3 ^ in_RDI) >> 0x25) * -0x61c8864e7a143579 +
               0x85ebca77c2b2ae63;
  case 0x11:
    xVar3 = XXH_readLE64_align(in_stack_ffffffffffffff08,XXH_aligned);
    xVar3 = XXH64_round(0,xVar3);
    local_18 = local_18 + 8;
    local_10 = ((xVar3 ^ local_10) << 0x1b | (xVar3 ^ local_10) >> 0x25) * -0x61c8864e7a143579 +
               0x85ebca77c2b2ae63;
  case 9:
    xVar3 = XXH_readLE64_align(in_stack_ffffffffffffff08,XXH_aligned);
    xVar3 = XXH64_round(0,xVar3);
    uVar2 = (ulong)local_18[8] * 0x27d4eb2f165667c5 ^
            ((xVar3 ^ local_10) << 0x1b | (xVar3 ^ local_10) >> 0x25) * -0x61c8864e7a143579 +
            0x85ebca77c2b2ae63;
    local_8 = XXH64_avalanche((uVar2 << 0xb | uVar2 >> 0x35) * -0x61c8864e7a143579);
    break;
  case 0x1a:
    xVar3 = XXH_readLE64_align(in_stack_ffffffffffffff08,XXH_aligned);
    xVar3 = XXH64_round(0,xVar3);
    local_18 = in_RSI + 8;
    local_10 = ((xVar3 ^ in_RDI) << 0x1b | (xVar3 ^ in_RDI) >> 0x25) * -0x61c8864e7a143579 +
               0x85ebca77c2b2ae63;
  case 0x12:
    xVar3 = XXH_readLE64_align(in_stack_ffffffffffffff08,XXH_aligned);
    xVar3 = XXH64_round(0,xVar3);
    local_18 = local_18 + 8;
    local_10 = ((xVar3 ^ local_10) << 0x1b | (xVar3 ^ local_10) >> 0x25) * -0x61c8864e7a143579 +
               0x85ebca77c2b2ae63;
  case 10:
    xVar3 = XXH_readLE64_align(in_stack_ffffffffffffff08,XXH_aligned);
    xVar3 = XXH64_round(0,xVar3);
    uVar2 = (ulong)local_18[8] * 0x27d4eb2f165667c5 ^
            ((xVar3 ^ local_10) << 0x1b | (xVar3 ^ local_10) >> 0x25) * -0x61c8864e7a143579 +
            0x85ebca77c2b2ae63;
    uVar2 = (ulong)local_18[9] * 0x27d4eb2f165667c5 ^
            (uVar2 << 0xb | uVar2 >> 0x35) * -0x61c8864e7a143579;
    local_8 = XXH64_avalanche((uVar2 << 0xb | uVar2 >> 0x35) * -0x61c8864e7a143579);
    break;
  case 0x1b:
    xVar3 = XXH_readLE64_align(in_stack_ffffffffffffff08,XXH_aligned);
    xVar3 = XXH64_round(0,xVar3);
    local_18 = in_RSI + 8;
    local_10 = ((xVar3 ^ in_RDI) << 0x1b | (xVar3 ^ in_RDI) >> 0x25) * -0x61c8864e7a143579 +
               0x85ebca77c2b2ae63;
  case 0x13:
    xVar3 = XXH_readLE64_align(in_stack_ffffffffffffff08,XXH_aligned);
    xVar3 = XXH64_round(0,xVar3);
    local_18 = local_18 + 8;
    local_10 = ((xVar3 ^ local_10) << 0x1b | (xVar3 ^ local_10) >> 0x25) * -0x61c8864e7a143579 +
               0x85ebca77c2b2ae63;
  case 0xb:
    xVar3 = XXH_readLE64_align(in_stack_ffffffffffffff08,XXH_aligned);
    xVar3 = XXH64_round(0,xVar3);
    uVar2 = (ulong)local_18[8] * 0x27d4eb2f165667c5 ^
            ((xVar3 ^ local_10) << 0x1b | (xVar3 ^ local_10) >> 0x25) * -0x61c8864e7a143579 +
            0x85ebca77c2b2ae63;
    uVar2 = (ulong)local_18[9] * 0x27d4eb2f165667c5 ^
            (uVar2 << 0xb | uVar2 >> 0x35) * -0x61c8864e7a143579;
    uVar2 = (ulong)local_18[10] * 0x27d4eb2f165667c5 ^
            (uVar2 << 0xb | uVar2 >> 0x35) * -0x61c8864e7a143579;
    local_8 = XXH64_avalanche((uVar2 << 0xb | uVar2 >> 0x35) * -0x61c8864e7a143579);
    break;
  case 0x1c:
    xVar3 = XXH_readLE64_align(in_stack_ffffffffffffff08,XXH_aligned);
    xVar3 = XXH64_round(0,xVar3);
    local_10 = ((xVar3 ^ in_RDI) << 0x1b | (xVar3 ^ in_RDI) >> 0x25) * -0x61c8864e7a143579 +
               0x85ebca77c2b2ae63;
  case 0x14:
    xVar3 = XXH_readLE64_align(in_stack_ffffffffffffff08,XXH_aligned);
    xVar3 = XXH64_round(0,xVar3);
    local_10 = ((xVar3 ^ local_10) << 0x1b | (xVar3 ^ local_10) >> 0x25) * -0x61c8864e7a143579 +
               0x85ebca77c2b2ae63;
  case 0xc:
    xVar3 = XXH_readLE64_align(in_stack_ffffffffffffff08,XXH_aligned);
    xVar3 = XXH64_round(0,xVar3);
    local_10 = ((xVar3 ^ local_10) << 0x1b | (xVar3 ^ local_10) >> 0x25) * -0x61c8864e7a143579 +
               0x85ebca77c2b2ae63;
  case 4:
    xVar1 = XXH_readLE32_align(in_stack_ffffffffffffff08,XXH_aligned);
    local_10 = (ulong)xVar1 * -0x61c8864e7a143579 ^ local_10;
    local_8 = XXH64_avalanche((local_10 << 0x17 | local_10 >> 0x29) * -0x3d4d51c2d82b14b1 +
                              0x165667b19e3779f9);
    break;
  case 0x1d:
    xVar3 = XXH_readLE64_align(in_stack_ffffffffffffff08,XXH_aligned);
    xVar3 = XXH64_round(0,xVar3);
    local_18 = in_RSI + 8;
    local_10 = ((xVar3 ^ in_RDI) << 0x1b | (xVar3 ^ in_RDI) >> 0x25) * -0x61c8864e7a143579 +
               0x85ebca77c2b2ae63;
  case 0x15:
    xVar3 = XXH_readLE64_align(in_stack_ffffffffffffff08,XXH_aligned);
    xVar3 = XXH64_round(0,xVar3);
    local_18 = local_18 + 8;
    local_10 = ((xVar3 ^ local_10) << 0x1b | (xVar3 ^ local_10) >> 0x25) * -0x61c8864e7a143579 +
               0x85ebca77c2b2ae63;
  case 0xd:
    xVar3 = XXH_readLE64_align(in_stack_ffffffffffffff08,XXH_aligned);
    xVar3 = XXH64_round(0,xVar3);
    local_18 = local_18 + 8;
    local_10 = ((xVar3 ^ local_10) << 0x1b | (xVar3 ^ local_10) >> 0x25) * -0x61c8864e7a143579 +
               0x85ebca77c2b2ae63;
  case 5:
    xVar1 = XXH_readLE32_align(in_stack_ffffffffffffff08,XXH_aligned);
    local_10 = (ulong)xVar1 * -0x61c8864e7a143579 ^ local_10;
    uVar2 = (ulong)local_18[4] * 0x27d4eb2f165667c5 ^
            (local_10 << 0x17 | local_10 >> 0x29) * -0x3d4d51c2d82b14b1 + 0x165667b19e3779f9;
    local_8 = XXH64_avalanche((uVar2 << 0xb | uVar2 >> 0x35) * -0x61c8864e7a143579);
    break;
  case 0x1e:
    xVar3 = XXH_readLE64_align(in_stack_ffffffffffffff08,XXH_aligned);
    xVar3 = XXH64_round(0,xVar3);
    local_18 = in_RSI + 8;
    local_10 = ((xVar3 ^ in_RDI) << 0x1b | (xVar3 ^ in_RDI) >> 0x25) * -0x61c8864e7a143579 +
               0x85ebca77c2b2ae63;
  case 0x16:
    xVar3 = XXH_readLE64_align(in_stack_ffffffffffffff08,XXH_aligned);
    xVar3 = XXH64_round(0,xVar3);
    local_18 = local_18 + 8;
    local_10 = ((xVar3 ^ local_10) << 0x1b | (xVar3 ^ local_10) >> 0x25) * -0x61c8864e7a143579 +
               0x85ebca77c2b2ae63;
  case 0xe:
    xVar3 = XXH_readLE64_align(in_stack_ffffffffffffff08,XXH_aligned);
    xVar3 = XXH64_round(0,xVar3);
    local_18 = local_18 + 8;
    local_10 = ((xVar3 ^ local_10) << 0x1b | (xVar3 ^ local_10) >> 0x25) * -0x61c8864e7a143579 +
               0x85ebca77c2b2ae63;
  case 6:
    xVar1 = XXH_readLE32_align(in_stack_ffffffffffffff08,XXH_aligned);
    local_10 = (ulong)xVar1 * -0x61c8864e7a143579 ^ local_10;
    uVar2 = (ulong)local_18[4] * 0x27d4eb2f165667c5 ^
            (local_10 << 0x17 | local_10 >> 0x29) * -0x3d4d51c2d82b14b1 + 0x165667b19e3779f9;
    uVar2 = (ulong)local_18[5] * 0x27d4eb2f165667c5 ^
            (uVar2 << 0xb | uVar2 >> 0x35) * -0x61c8864e7a143579;
    local_8 = XXH64_avalanche((uVar2 << 0xb | uVar2 >> 0x35) * -0x61c8864e7a143579);
    break;
  case 0x1f:
    xVar3 = XXH_readLE64_align(in_stack_ffffffffffffff08,XXH_aligned);
    xVar3 = XXH64_round(0,xVar3);
    local_18 = in_RSI + 8;
    local_10 = ((xVar3 ^ in_RDI) << 0x1b | (xVar3 ^ in_RDI) >> 0x25) * -0x61c8864e7a143579 +
               0x85ebca77c2b2ae63;
  case 0x17:
    xVar3 = XXH_readLE64_align(in_stack_ffffffffffffff08,XXH_aligned);
    xVar3 = XXH64_round(0,xVar3);
    local_18 = local_18 + 8;
    local_10 = ((xVar3 ^ local_10) << 0x1b | (xVar3 ^ local_10) >> 0x25) * -0x61c8864e7a143579 +
               0x85ebca77c2b2ae63;
  case 0xf:
    xVar3 = XXH_readLE64_align(in_stack_ffffffffffffff08,XXH_aligned);
    xVar3 = XXH64_round(0,xVar3);
    local_18 = local_18 + 8;
    local_10 = ((xVar3 ^ local_10) << 0x1b | (xVar3 ^ local_10) >> 0x25) * -0x61c8864e7a143579 +
               0x85ebca77c2b2ae63;
  case 7:
    xVar1 = XXH_readLE32_align(in_stack_ffffffffffffff08,XXH_aligned);
    local_10 = (ulong)xVar1 * -0x61c8864e7a143579 ^ local_10;
    local_18 = local_18 + 4;
    local_10 = (local_10 << 0x17 | local_10 >> 0x29) * -0x3d4d51c2d82b14b1 + 0x165667b19e3779f9;
  case 3:
    local_10 = (ulong)*local_18 * 0x27d4eb2f165667c5 ^ local_10;
    local_10 = (local_10 << 0xb | local_10 >> 0x35) * -0x61c8864e7a143579;
    local_18 = local_18 + 1;
  case 2:
    local_10 = (ulong)*local_18 * 0x27d4eb2f165667c5 ^ local_10;
    local_10 = (local_10 << 0xb | local_10 >> 0x35) * -0x61c8864e7a143579;
    local_18 = local_18 + 1;
  case 1:
    local_10 = (ulong)*local_18 * 0x27d4eb2f165667c5 ^ local_10;
    local_10 = (local_10 << 0xb | local_10 >> 0x35) * -0x61c8864e7a143579;
  case 0:
    local_8 = XXH64_avalanche(local_10);
    break;
  default:
    local_8 = 0;
  }
  return local_8;
}

Assistant:

static xxh_u64 XXH64_finalize(xxh_u64 h64, const xxh_u8* ptr, size_t len,
                              XXH_alignment align) {
#define XXH_PROCESS1_64                        \
  do {                                         \
    h64 ^= (*ptr++) * XXH_PRIME64_5;           \
    h64 = XXH_rotl64(h64, 11) * XXH_PRIME64_1; \
  } while (0)

#define XXH_PROCESS4_64                                        \
  do {                                                         \
    h64 ^= (xxh_u64)(XXH_get32bits(ptr)) * XXH_PRIME64_1;      \
    ptr += 4;                                                  \
    h64 = XXH_rotl64(h64, 23) * XXH_PRIME64_2 + XXH_PRIME64_3; \
  } while (0)

#define XXH_PROCESS8_64                                        \
  do {                                                         \
    xxh_u64 const k1 = XXH64_round(0, XXH_get64bits(ptr));     \
    ptr += 8;                                                  \
    h64 ^= k1;                                                 \
    h64 = XXH_rotl64(h64, 27) * XXH_PRIME64_1 + XXH_PRIME64_4; \
  } while (0)

  /* Rerolled version for 32-bit targets is faster and much smaller. */
  if (XXH_REROLL || XXH_REROLL_XXH64) {
    len &= 31;
    while (len >= 8) {
      XXH_PROCESS8_64;
      len -= 8;
    }
    if (len >= 4) {
      XXH_PROCESS4_64;
      len -= 4;
    }
    while (len > 0) {
      XXH_PROCESS1_64;
      --len;
    }
    return XXH64_avalanche(h64);
  } else {
    switch (len & 31) {
      case 24:
        XXH_PROCESS8_64;
        /* fallthrough */
      case 16:
        XXH_PROCESS8_64;
        /* fallthrough */
      case 8:
        XXH_PROCESS8_64;
        return XXH64_avalanche(h64);

      case 28:
        XXH_PROCESS8_64;
        /* fallthrough */
      case 20:
        XXH_PROCESS8_64;
        /* fallthrough */
      case 12:
        XXH_PROCESS8_64;
        /* fallthrough */
      case 4:
        XXH_PROCESS4_64;
        return XXH64_avalanche(h64);

      case 25:
        XXH_PROCESS8_64;
        /* fallthrough */
      case 17:
        XXH_PROCESS8_64;
        /* fallthrough */
      case 9:
        XXH_PROCESS8_64;
        XXH_PROCESS1_64;
        return XXH64_avalanche(h64);

      case 29:
        XXH_PROCESS8_64;
        /* fallthrough */
      case 21:
        XXH_PROCESS8_64;
        /* fallthrough */
      case 13:
        XXH_PROCESS8_64;
        /* fallthrough */
      case 5:
        XXH_PROCESS4_64;
        XXH_PROCESS1_64;
        return XXH64_avalanche(h64);

      case 26:
        XXH_PROCESS8_64;
        /* fallthrough */
      case 18:
        XXH_PROCESS8_64;
        /* fallthrough */
      case 10:
        XXH_PROCESS8_64;
        XXH_PROCESS1_64;
        XXH_PROCESS1_64;
        return XXH64_avalanche(h64);

      case 30:
        XXH_PROCESS8_64;
        /* fallthrough */
      case 22:
        XXH_PROCESS8_64;
        /* fallthrough */
      case 14:
        XXH_PROCESS8_64;
        /* fallthrough */
      case 6:
        XXH_PROCESS4_64;
        XXH_PROCESS1_64;
        XXH_PROCESS1_64;
        return XXH64_avalanche(h64);

      case 27:
        XXH_PROCESS8_64;
        /* fallthrough */
      case 19:
        XXH_PROCESS8_64;
        /* fallthrough */
      case 11:
        XXH_PROCESS8_64;
        XXH_PROCESS1_64;
        XXH_PROCESS1_64;
        XXH_PROCESS1_64;
        return XXH64_avalanche(h64);

      case 31:
        XXH_PROCESS8_64;
        /* fallthrough */
      case 23:
        XXH_PROCESS8_64;
        /* fallthrough */
      case 15:
        XXH_PROCESS8_64;
        /* fallthrough */
      case 7:
        XXH_PROCESS4_64;
        /* fallthrough */
      case 3:
        XXH_PROCESS1_64;
        /* fallthrough */
      case 2:
        XXH_PROCESS1_64;
        /* fallthrough */
      case 1:
        XXH_PROCESS1_64;
        /* fallthrough */
      case 0:
        return XXH64_avalanche(h64);
    }
  }
  /* impossible to reach */
  XXH_ASSERT(0);
  return 0; /* unreachable, but some compilers complain without it */
}